

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O2

string * __thiscall
testing::internal::FormatEpochTimeInMillisAsIso8601_abi_cxx11_
          (string *__return_storage_ptr__,internal *this,TimeInMillis ms)

{
  tm *ptVar1;
  int value;
  int value_00;
  int value_01;
  int value_02;
  int value_03;
  time_t seconds;
  int local_204;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_200;
  string local_1e0;
  string local_1c0;
  string local_1a0;
  string local_180;
  string local_160;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_140;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_120;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_100;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  long local_40;
  string local_38;
  
  local_40 = (long)this / 1000;
  ptVar1 = localtime(&local_40);
  if (ptVar1 == (tm *)0x0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"",(allocator<char> *)&local_200);
  }
  else {
    local_204 = ptVar1->tm_year + 0x76c;
    StreamableToString<int>(&local_38,&local_204);
    std::operator+(&local_140,&local_38,"-");
    String::FormatIntWidth2_abi_cxx11_(&local_160,(String *)(ulong)(ptVar1->tm_mon + 1),value);
    std::operator+(&local_120,&local_140,&local_160);
    std::operator+(&local_100,&local_120,"-");
    String::FormatIntWidth2_abi_cxx11_(&local_180,(String *)(ulong)(uint)ptVar1->tm_mday,value_00);
    std::operator+(&local_e0,&local_100,&local_180);
    std::operator+(&local_c0,&local_e0,"T");
    String::FormatIntWidth2_abi_cxx11_(&local_1a0,(String *)(ulong)(uint)ptVar1->tm_hour,value_01);
    std::operator+(&local_a0,&local_c0,&local_1a0);
    std::operator+(&local_80,&local_a0,":");
    String::FormatIntWidth2_abi_cxx11_(&local_1c0,(String *)(ulong)(uint)ptVar1->tm_min,value_02);
    std::operator+(&local_60,&local_80,&local_1c0);
    std::operator+(&local_200,&local_60,":");
    String::FormatIntWidth2_abi_cxx11_(&local_1e0,(String *)(ulong)(uint)ptVar1->tm_sec,value_03);
    std::operator+(__return_storage_ptr__,&local_200,&local_1e0);
    std::__cxx11::string::~string((string *)&local_1e0);
    std::__cxx11::string::~string((string *)&local_200);
    std::__cxx11::string::~string((string *)&local_60);
    std::__cxx11::string::~string((string *)&local_1c0);
    std::__cxx11::string::~string((string *)&local_80);
    std::__cxx11::string::~string((string *)&local_a0);
    std::__cxx11::string::~string((string *)&local_1a0);
    std::__cxx11::string::~string((string *)&local_c0);
    std::__cxx11::string::~string((string *)&local_e0);
    std::__cxx11::string::~string((string *)&local_180);
    std::__cxx11::string::~string((string *)&local_100);
    std::__cxx11::string::~string((string *)&local_120);
    std::__cxx11::string::~string((string *)&local_160);
    std::__cxx11::string::~string((string *)&local_140);
    std::__cxx11::string::~string((string *)&local_38);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string FormatEpochTimeInMillisAsIso8601(TimeInMillis ms) {
  // Using non-reentrant version as localtime_r is not portable.
  time_t seconds = static_cast<time_t>(ms / 1000);
#ifdef _MSC_VER
# pragma warning(push)          // Saves the current warning state.
# pragma warning(disable:4996)  // Temporarily disables warning 4996
                                // (function or variable may be unsafe).
  const struct tm* const time_struct = localtime(&seconds);  // NOLINT
# pragma warning(pop)           // Restores the warning state again.
#else
  const struct tm* const time_struct = localtime(&seconds);  // NOLINT
#endif
  if (time_struct == NULL)
    return "";  // Invalid ms value

  // YYYY-MM-DDThh:mm:ss
  return StreamableToString(time_struct->tm_year + 1900) + "-" +
      String::FormatIntWidth2(time_struct->tm_mon + 1) + "-" +
      String::FormatIntWidth2(time_struct->tm_mday) + "T" +
      String::FormatIntWidth2(time_struct->tm_hour) + ":" +
      String::FormatIntWidth2(time_struct->tm_min) + ":" +
      String::FormatIntWidth2(time_struct->tm_sec);
}